

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O3

Action __thiscall
psy::C::DeclarationBinder::visitIdentifierDeclarator
          (DeclarationBinder *this,IdentifierDeclaratorSyntax *node)

{
  Action AVar1;
  Identifier *pIVar2;
  TypedefNameType *args;
  TypedefDeclarationSymbol *decl;
  SpecifierListSyntax *pSVar3;
  SyntaxToken local_50;
  
  for (pSVar3 = node->attrs1_; pSVar3 != (SpecifierListSyntax *)0x0;
      pSVar3 = (pSVar3->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next) {
    AVar1 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pSVar3->
                         super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                         ).
                         super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar1 == Quit) {
      return Quit;
    }
  }
  if (((uint)this->field_7 & 1) == 0) {
    handleNonTypedefDeclarator(this,&node->super_DeclaratorSyntax);
    SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->identTkIdx_);
    pIVar2 = obtainName(this,&local_50);
    nameDeclarationAtTop(this,pIVar2);
    SyntaxToken::~SyntaxToken(&local_50);
  }
  else {
    SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->identTkIdx_);
    pIVar2 = obtainName(this,&local_50);
    SyntaxToken::~SyntaxToken(&local_50);
    args = makeType<psy::C::TypedefNameType,psy::C::Identifier_const*>(this,pIVar2);
    decl = bindDeclaration<psy::C::TypedefDeclarationSymbol,psy::C::TypedefNameType*>
                     (this,(SyntaxNode *)node,args);
    if (pIVar2 == this->ptrdiff_t_) {
      SemanticModel::set_ptrdiff_t_typedef(this->semaModel_,decl);
    }
    else if (pIVar2 == this->size_t_) {
      SemanticModel::set_size_t_typedef(this->semaModel_,decl);
    }
    else if (pIVar2 == this->max_align_t_) {
      SemanticModel::set_max_align_t_typedef(this->semaModel_,decl);
    }
    else if (pIVar2 == this->wchar_t_) {
      SemanticModel::set_wchar_t_typedef(this->semaModel_,decl);
    }
    else if (pIVar2 == this->char16_t_) {
      SemanticModel::set_char16_t_typedef(this->semaModel_,decl);
    }
    else if (pIVar2 == this->char32_t_) {
      SemanticModel::set_char32_t_typedef(this->semaModel_,decl);
    }
  }
  pSVar3 = node->attrs2_;
  while( true ) {
    if (pSVar3 == (SpecifierListSyntax *)0x0) {
      AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
      return (AVar1 == Quit) + Skip;
    }
    AVar1 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pSVar3->
                         super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                         ).
                         super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar1 == Quit) break;
    pSVar3 = (pSVar3->
             super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             ).
             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitIdentifierDeclarator(const IdentifierDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    if (F_.inTydefDecltor_) {
        auto name = obtainName(node->identifierToken());
        auto tydefNameTy = makeType<TypedefNameType>(name);
        auto decl = bindDeclaration<TypedefDeclarationSymbol>(node, tydefNameTy);

        if (name == ptrdiff_t_)
            semaModel_->set_ptrdiff_t_typedef(decl);
        else if (name == size_t_)
            semaModel_->set_size_t_typedef(decl);
        else if (name == max_align_t_)
            semaModel_->set_max_align_t_typedef(decl);
        else if (name == wchar_t_)
            semaModel_->set_wchar_t_typedef(decl);
        else if (name == char16_t_)
            semaModel_->set_char16_t_typedef(decl);
        else if (name == char32_t_)
            semaModel_->set_char32_t_typedef(decl);
    }
    else {
        handleNonTypedefDeclarator(node);
        nameDeclarationAtTop(obtainName(node->identifierToken()));
    }

    VISIT(node->attributes_PostIdentifier());
    VISIT(node->initializer());

    return Action::Skip;
}